

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenSIMDShuffleGetMask(BinaryenExpressionRef expr,uint8_t *mask)

{
  uintptr_t uVar1;
  
  if (expr->_id != SIMDShuffleId) {
    __assert_fail("expression->is<SIMDShuffle>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xcc9,"void BinaryenSIMDShuffleGetMask(BinaryenExpressionRef, uint8_t *)");
  }
  if (mask != (uint8_t *)0x0) {
    uVar1 = expr[2].type.id;
    *(undefined8 *)mask = *(undefined8 *)(expr + 2);
    *(uintptr_t *)(mask + 8) = uVar1;
    return;
  }
  __assert_fail("mask",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xcca,"void BinaryenSIMDShuffleGetMask(BinaryenExpressionRef, uint8_t *)");
}

Assistant:

void BinaryenSIMDShuffleGetMask(BinaryenExpressionRef expr, uint8_t* mask) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDShuffle>());
  assert(mask); // nullptr would be wrong
  memcpy(mask, static_cast<SIMDShuffle*>(expression)->mask.data(), 16);
}